

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryDecoder.cc
# Opt level: O1

void __thiscall avro::BinaryDecoder::decodeString(BinaryDecoder *this,string *value)

{
  int iVar1;
  
  iVar1 = (*(this->super_Decoder)._vptr_Decoder[5])();
  std::__cxx11::string::resize((ulong)value,(char)iVar1);
  if (iVar1 != 0) {
    StreamReader::readBytes(&this->in_,(uint8_t *)(value->_M_dataplus)._M_p,(long)iVar1);
    return;
  }
  return;
}

Assistant:

void BinaryDecoder::decodeString(std::string& value)
{
    size_t len = decodeInt();
    value.resize(len);
    if (len > 0) {
        in_.readBytes(reinterpret_cast<uint8_t*>(&value[0]), len);
    }
}